

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::ShutdownClearSourceLists(ScriptContext *this)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *this_00;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar7;
  ScriptContext *this_01;
  ScriptContext *pSVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    if ((this->super_ScriptContextBase).isClosed == true) {
      pLVar7 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(&this->sourceList);
      iVar11 = (pLVar7->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).count;
      if (0 < iVar11) {
        this_01 = (ScriptContext *)__tls_get_addr(&PTR_01548f08);
        lVar10 = 0;
        do {
          pRVar1 = (pLVar7->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[lVar10].ptr;
          if ((((((ulong)pRVar1 & 1) == 0 &&
                 pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
               (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0))
              && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) &&
             (uVar6 = *(uint *)((long)plVar3 + 0x1c), uVar6 != 0)) {
            uVar9 = 0;
            do {
              iVar11 = *(int *)(*plVar3 + uVar9 * 4);
              if (iVar11 != -1) {
                do {
                  this_00 = *(FunctionBody **)(plVar3[1] + (long)iVar11 * 0x10);
                  if (this_00 == (FunctionBody *)0x0) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *(undefined4 *)&(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
                    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                ,0xa2,"(functionBody)","functionBody");
                    if (bVar5) {
                      ShutdownClearSourceLists(this_01);
                    }
LAB_00783bc2:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  iVar11 = *(int *)(plVar3[1] + 8 + (long)iVar11 * 0x10);
                  pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
                  if (pSVar8 != this) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *(undefined4 *)&(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
                    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                                ,400,"(functionBody->GetScriptContext() == this)",
                                                "functionBody->GetScriptContext() == this");
                    if (!bVar5) goto LAB_00783bc2;
                    *(undefined4 *)&(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
                  }
                  FunctionBody::CleanupSourceInfo(this_00,true);
                } while (iVar11 != -1);
                uVar6 = *(uint *)((long)plVar3 + 0x1c);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar6);
            iVar11 = (pLVar7->
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                     ).count;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar11);
      }
    }
    EnsureClearDebugDocument(this);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
    ::Unroot(&this->sourceList,this->recycler);
  }
  if ((this->calleeUtf8SourceInfoList).ptr ==
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    return;
  }
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  ::Unroot(&this->calleeUtf8SourceInfoList,this->recycler);
  return;
}

Assistant:

void ScriptContext::ShutdownClearSourceLists()
    {
        if (this->sourceList)
        {
            // In the unclean shutdown case, we might not have destroyed the script context when
            // this is called- in which case, skip doing this work and simply release the source list
            // so that it doesn't show up as a leak. Since we're doing unclean shutdown, it's ok to
            // skip cleanup here for expediency.
            if (this->isClosed)
            {
                this->MapFunction([this](Js::FunctionBody* functionBody) {
                    Assert(functionBody->GetScriptContext() == this);
                    functionBody->CleanupSourceInfo(true);
                });
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            EnsureClearDebugDocument();
#endif

            // Don't need the source list any more so ok to release
            this->sourceList.Unroot(this->GetRecycler());
        }

        if (this->calleeUtf8SourceInfoList)
        {
            this->calleeUtf8SourceInfoList.Unroot(this->GetRecycler());
        }
    }